

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O3

HighsDebugStatus
debugDualSolutionRightSize(HighsOptions *options,HighsLp *lp,HighsSolution *solution)

{
  bool bVar1;
  HighsDebugStatus HVar2;
  
  if (0 < (options->super_HighsOptionsStruct).highs_debug_level) {
    bVar1 = isDualSolutionRightSize(lp,solution);
    HVar2 = kOk;
    if (!bVar1) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,
                   "HiGHS dual solution size error\n");
      HVar2 = kLogicalError;
    }
    return HVar2;
  }
  return kNotChecked;
}

Assistant:

HighsDebugStatus debugDualSolutionRightSize(const HighsOptions& options,
                                            const HighsLp& lp,
                                            const HighsSolution& solution) {
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  bool right_size = isDualSolutionRightSize(lp, solution);
  if (!right_size) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "HiGHS dual solution size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}